

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

void __thiscall
wabt::interp::anon_unknown_1::FixupMap::Resolve(FixupMap *this,Istream *istream,Index index)

{
  bool bVar1;
  pointer ppVar2;
  reference puVar3;
  iterator iStack_48;
  Offset offset;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  _Self local_28;
  iterator iter;
  Index index_local;
  Istream *istream_local;
  FixupMap *this_local;
  
  iter._M_node._4_4_ = index;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->map,(key_type *)((long)&iter._M_node + 4));
  __range2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::end(&this->map);
  bVar1 = std::operator==(&local_28,(_Self *)&__range2);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_28);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&ppVar2->second);
    iStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      Istream::ResolveFixupU32(istream,*puVar3);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    std::
    map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
    ::erase_abi_cxx11_((map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                        *)this,(iterator)local_28._M_node);
  }
  return;
}

Assistant:

void FixupMap::Resolve(Istream& istream, Index index) {
  auto iter = map.find(index);
  if (iter == map.end()) {
    return;
  }
  for (Offset offset : iter->second) {
    istream.ResolveFixupU32(offset);
  }
  map.erase(iter);
}